

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::ParsedIR::set_member_decoration_string
          (ParsedIR *this,TypeID id,uint32_t index,Decoration decoration,string *argument)

{
  unsigned_long *puVar1;
  mapped_type *pmVar2;
  Vector<Decoration> *this_00;
  TypedID<(diligent_spirv_cross::Types)0> local_54;
  Decoration *local_50;
  Decoration *dec;
  size_t local_40;
  TypedID<(diligent_spirv_cross::Types)0> local_34;
  mapped_type *local_30;
  mapped_type *m;
  string *argument_local;
  Decoration decoration_local;
  uint32_t index_local;
  ParsedIR *this_local;
  TypeID id_local;
  
  m = (mapped_type *)argument;
  argument_local._0_4_ = decoration;
  argument_local._4_4_ = index;
  _decoration_local = this;
  this_local._4_4_ = id.id;
  TypedID<(diligent_spirv_cross::Types)0>::TypedID<(diligent_spirv_cross::Types)1>
            (&local_34,(TypedID<(diligent_spirv_cross::Types)1> *)((long)&this_local + 4));
  local_30 = ::std::
             unordered_map<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>_>
             ::operator[](&this->meta,&local_34);
  this_00 = &local_30->members;
  local_40 = VectorView<diligent_spirv_cross::Meta::Decoration>::size
                       (&this_00->super_VectorView<diligent_spirv_cross::Meta::Decoration>);
  dec = (Decoration *)((ulong)argument_local._4_4_ + 1);
  puVar1 = ::std::max<unsigned_long>(&local_40,(unsigned_long *)&dec);
  SmallVector<diligent_spirv_cross::Meta::Decoration,_0UL>::resize(this_00,*puVar1);
  TypedID<(diligent_spirv_cross::Types)0>::TypedID<(diligent_spirv_cross::Types)1>
            (&local_54,(TypedID<(diligent_spirv_cross::Types)1> *)((long)&this_local + 4));
  pmVar2 = ::std::
           unordered_map<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>_>
           ::operator[](&this->meta,&local_54);
  local_50 = VectorView<diligent_spirv_cross::Meta::Decoration>::operator[]
                       (&(pmVar2->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>,
                        (ulong)argument_local._4_4_);
  Bitset::set(&local_50->decoration_flags,(Decoration)argument_local);
  if ((Decoration)argument_local == DecorationHlslSemanticGOOGLE) {
    ::std::__cxx11::string::operator=((string *)&local_50->hlsl_semantic,(string *)m);
  }
  return;
}

Assistant:

void ParsedIR::set_member_decoration_string(TypeID id, uint32_t index, Decoration decoration, const string &argument)
{
	auto &m = meta[id];
	m.members.resize(max(m.members.size(), size_t(index) + 1));
	auto &dec = meta[id].members[index];
	dec.decoration_flags.set(decoration);

	switch (decoration)
	{
	case DecorationHlslSemanticGOOGLE:
		dec.hlsl_semantic = argument;
		break;

	default:
		break;
	}
}